

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

uint32 __thiscall Js::DiagScopeVariablesWalker::GetChildrenCount(DiagScopeVariablesWalker *this)

{
  DiagStackFrame *pDVar1;
  DiagStackFrame *pDVar2;
  code *pcVar3;
  ArenaAllocator *_scriptContext;
  bool bVar4;
  int iVar5;
  uint32 uVar6;
  RegSlot RVar7;
  undefined4 *puVar8;
  undefined4 extraout_var;
  ScopeObjectChain *pSVar9;
  undefined4 extraout_var_00;
  List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar10;
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar11
  ;
  WriteBarrierPtr *this_00;
  DebuggerScope **ppDVar12;
  RecyclableObjectWalker *this_01;
  undefined4 extraout_var_01;
  CatchScopeWalker *this_02;
  RegSlotVariablesWalker *pRVar13;
  undefined4 extraout_var_02;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar14;
  ObjectVariablesWalker *this_03;
  undefined4 extraout_var_03;
  ObjectVariablesWalker *local_1c0;
  code *local_1b8;
  undefined8 local_1b0;
  TrackAllocData local_1a8;
  ObjectVariablesWalker *local_180;
  ObjectVariablesWalker *objectVariablesWalker;
  code *local_170;
  undefined8 local_168;
  TrackAllocData local_160;
  RegSlotVariablesWalker *local_138;
  RegSlotVariablesWalker *pObjWalker;
  code *local_128;
  undefined8 local_120;
  TrackAllocData local_118;
  RegSlotVariablesWalker *local_f0;
  SlotArrayVariablesWalker *blockScopeWalker;
  code *local_e0;
  undefined8 local_d8;
  TrackAllocData local_d0;
  CatchScopeWalker *local_a8;
  CatchScopeWalker *catchScopeWalker;
  code *local_98;
  undefined8 local_90;
  TrackAllocData local_88;
  RecyclableObjectWalker *local_60;
  RecyclableObjectWalker *recylableObjectWalker;
  DebuggerScope *pDStack_50;
  bool isScopeInRange;
  DebuggerScope *debuggerScope;
  ScopeObjectChain *pSStack_40;
  int i;
  ScopeObjectChain *pScopeObjectChain;
  ArenaAllocator *arena;
  ScriptContext *scriptContext;
  FunctionBody *pFStack_20;
  int bytecodeOffset;
  FunctionBody *pFBody;
  DiagScopeVariablesWalker *this_local;
  
  if ((this->scopeIsInitialized & 1U) == 0) {
    pFBody = (FunctionBody *)this;
    if ((this->super_VariableWalkerBase).pFrame == (DiagStackFrame *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x3ac,"(pFrame)","pFrame");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    iVar5 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[2])();
    pFStack_20 = JavascriptFunction::GetFunctionBody
                           ((JavascriptFunction *)CONCAT44(extraout_var,iVar5));
    pSVar9 = FunctionBody::GetScopeObjectChain(pFStack_20);
    if (pSVar9 != (ScopeObjectChain *)0x0) {
      scriptContext._4_4_ =
           VariableWalkerBase::GetAdjustedByteCodeOffset(&this->super_VariableWalkerBase);
      iVar5 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[10])();
      arena = (ArenaAllocator *)CONCAT44(extraout_var_00,iVar5);
      pScopeObjectChain = (ScopeObjectChain *)GetArenaFromContext((ScriptContext *)arena);
      pLVar10 = JsUtil::
                List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::New((ArenaAllocator *)pScopeObjectChain,4);
      this->pDiagScopeObjects = pLVar10;
      pSStack_40 = FunctionBody::GetScopeObjectChain(pFStack_20);
      pLVar11 = Memory::
                WriteBarrierPtr<JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                ::operator->(&pSStack_40->pScopeChain);
      debuggerScope._4_4_ =
           JsUtil::ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>::Count
                     (&pLVar11->
                       super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>);
      while (debuggerScope._4_4_ = debuggerScope._4_4_ + -1, -1 < debuggerScope._4_4_) {
        pLVar11 = Memory::
                  WriteBarrierPtr<JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                  ::operator->(&pSStack_40->pScopeChain);
        this_00 = (WriteBarrierPtr *)
                  JsUtil::
                  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(pLVar11,debuggerScope._4_4_);
        ppDVar12 = Memory::WriteBarrierPtr::operator_cast_to_DebuggerScope__(this_00);
        pDStack_50 = *ppDVar12;
        recylableObjectWalker._7_1_ = DebuggerScope::IsOffsetInScope(pDStack_50,scriptContext._4_4_)
        ;
        if ((((bool)recylableObjectWalker._7_1_) &&
            (bVar4 = DebuggerScope::IsParamScope(pDStack_50), !bVar4)) &&
           ((bVar4 = DebuggerScope::IsOwnScope(pDStack_50), bVar4 ||
            ((pDStack_50->scopeType == DiagBlockScopeDirect &&
             (bVar4 = DebuggerScope::HasProperties(pDStack_50), bVar4)))))) {
          pSVar9 = pScopeObjectChain;
          switch(pDStack_50->scopeType) {
          case DiagWithScope:
            if ((this->enumWithScopeAlso & 1U) != 0) {
              Memory::TrackAllocData::CreateTrackAllocData
                        (&local_88,(type_info *)&RecyclableObjectWalker::typeinfo,0,
                         0xffffffffffffffff,
                         "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                         ,0x3ca);
              pAVar14 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                        TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                        *)pSVar9,&local_88);
              local_98 = Memory::ArenaAllocator::Alloc;
              local_90 = 0;
              this_01 = (RecyclableObjectWalker *)
                        new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar14,0x3f67b0);
              _scriptContext = arena;
              pDVar1 = (this->super_VariableWalkerBase).pFrame;
              RVar7 = DebuggerScope::GetLocation(pDStack_50);
              iVar5 = (*pDVar1->_vptr_DiagStackFrame[5])(pDVar1,(ulong)RVar7,1);
              RecyclableObjectWalker::RecyclableObjectWalker
                        (this_01,(ScriptContext *)_scriptContext,
                         (Var)CONCAT44(extraout_var_01,iVar5));
              catchScopeWalker = (CatchScopeWalker *)this_01;
              local_60 = this_01;
              JsUtil::
              List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Add(this->pDiagScopeObjects,(IDiagObjectModelWalkerBase **)&catchScopeWalker);
              iVar5 = (*(local_60->super_IDiagObjectModelWalkerBase).
                        _vptr_IDiagObjectModelWalkerBase[1])();
              this->diagScopeVarCount = iVar5 + this->diagScopeVarCount;
            }
            break;
          case DiagCatchScopeDirect:
          case DiagCatchScopeInObject:
            Memory::TrackAllocData::CreateTrackAllocData
                      (&local_d0,(type_info *)&CatchScopeWalker::typeinfo,0,0xffffffffffffffff,
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                       ,0x3d3);
            pAVar14 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                      TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                      *)pSVar9,&local_d0);
            local_e0 = Memory::ArenaAllocator::Alloc;
            local_d8 = 0;
            this_02 = (CatchScopeWalker *)
                      new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)pAVar14,0x3f67b0);
            CatchScopeWalker::CatchScopeWalker
                      (this_02,(this->super_VariableWalkerBase).pFrame,pDStack_50);
            blockScopeWalker = (SlotArrayVariablesWalker *)this_02;
            local_a8 = this_02;
            JsUtil::
            List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Add(this->pDiagScopeObjects,(IDiagObjectModelWalkerBase **)&blockScopeWalker);
            uVar6 = CatchScopeWalker::GetChildrenCount(local_a8);
            this->diagScopeVarCount = uVar6 + this->diagScopeVarCount;
            break;
          case DiagCatchScopeInSlot:
          case DiagBlockScopeInSlot:
            Memory::TrackAllocData::CreateTrackAllocData
                      (&local_118,(type_info *)&SlotArrayVariablesWalker::typeinfo,0,
                       0xffffffffffffffff,
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                       ,0x3dc);
            pAVar14 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                      TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                      *)pSVar9,&local_118);
            local_128 = Memory::ArenaAllocator::Alloc;
            local_120 = 0;
            pRVar13 = (RegSlotVariablesWalker *)
                      new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar14,0x3f67b0);
            pDVar1 = (this->super_VariableWalkerBase).pFrame;
            pDVar2 = (this->super_VariableWalkerBase).pFrame;
            RVar7 = DebuggerScope::GetLocation(pDStack_50);
            iVar5 = (*pDVar2->_vptr_DiagStackFrame[0x12])(pDVar2,(ulong)RVar7);
            SlotArrayVariablesWalker::SlotArrayVariablesWalker
                      ((SlotArrayVariablesWalker *)pRVar13,pDVar1,
                       (Var)CONCAT44(extraout_var_02,iVar5),UIGroupType_InnerScope,false,false);
            pObjWalker = pRVar13;
            local_f0 = pRVar13;
            JsUtil::
            List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Add(this->pDiagScopeObjects,(IDiagObjectModelWalkerBase **)&pObjWalker);
            iVar5 = (*(local_f0->super_VariableWalkerBase).super_IDiagObjectModelWalkerBase.
                      _vptr_IDiagObjectModelWalkerBase[1])();
            this->diagScopeVarCount = iVar5 + this->diagScopeVarCount;
            break;
          case DiagBlockScopeDirect:
            Memory::TrackAllocData::CreateTrackAllocData
                      (&local_160,(type_info *)&RegSlotVariablesWalker::typeinfo,0,
                       0xffffffffffffffff,
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                       ,0x3e3);
            pAVar14 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                      TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                      *)pSVar9,&local_160);
            local_170 = Memory::ArenaAllocator::Alloc;
            local_168 = 0;
            pRVar13 = (RegSlotVariablesWalker *)
                      new<Memory::ArenaAllocator>(0x30,(ArenaAllocator *)pAVar14,0x3f67b0);
            RegSlotVariablesWalker::RegSlotVariablesWalker
                      (pRVar13,(this->super_VariableWalkerBase).pFrame,pDStack_50,
                       UIGroupType_InnerScope,false);
            objectVariablesWalker = (ObjectVariablesWalker *)pRVar13;
            local_138 = pRVar13;
            JsUtil::
            List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Add(this->pDiagScopeObjects,(IDiagObjectModelWalkerBase **)&objectVariablesWalker);
            iVar5 = (*(local_138->super_VariableWalkerBase).super_IDiagObjectModelWalkerBase.
                      _vptr_IDiagObjectModelWalkerBase[1])();
            this->diagScopeVarCount = iVar5 + this->diagScopeVarCount;
            break;
          case DiagBlockScopeInObject:
            Memory::TrackAllocData::CreateTrackAllocData
                      (&local_1a8,(type_info *)&ObjectVariablesWalker::typeinfo,0,0xffffffffffffffff
                       ,
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                       ,0x3ea);
            pAVar14 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                      TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                      *)pSVar9,&local_1a8);
            local_1b8 = Memory::ArenaAllocator::Alloc;
            local_1b0 = 0;
            this_03 = (ObjectVariablesWalker *)
                      new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar14,0x3f67b0);
            pDVar1 = (this->super_VariableWalkerBase).pFrame;
            pDVar2 = (this->super_VariableWalkerBase).pFrame;
            RVar7 = DebuggerScope::GetLocation(pDStack_50);
            iVar5 = (*pDVar2->_vptr_DiagStackFrame[0x12])(pDVar2,(ulong)RVar7);
            ObjectVariablesWalker::ObjectVariablesWalker
                      (this_03,pDVar1,(Var)CONCAT44(extraout_var_03,iVar5),UIGroupType_InnerScope,
                       false,false);
            local_1c0 = this_03;
            local_180 = this_03;
            JsUtil::
            List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Add(this->pDiagScopeObjects,(IDiagObjectModelWalkerBase **)&local_1c0);
            iVar5 = (*(local_180->super_VariableWalkerBase).super_IDiagObjectModelWalkerBase.
                      _vptr_IDiagObjectModelWalkerBase[1])();
            this->diagScopeVarCount = iVar5 + this->diagScopeVarCount;
            break;
          default:
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                        ,0x3f0,"(false)","false");
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
        }
      }
    }
    this->scopeIsInitialized = true;
    this_local._4_4_ = this->diagScopeVarCount;
  }
  else {
    this_local._4_4_ = this->diagScopeVarCount;
  }
  return this_local._4_4_;
}

Assistant:

uint32 DiagScopeVariablesWalker::GetChildrenCount()
    {
        if (scopeIsInitialized)
        {
            return diagScopeVarCount;
        }
        Assert(pFrame);
        Js::FunctionBody *pFBody = pFrame->GetJavascriptFunction()->GetFunctionBody();

        if (pFBody->GetScopeObjectChain())
        {
            int bytecodeOffset = GetAdjustedByteCodeOffset();
            ScriptContext * scriptContext = pFrame->GetScriptContext();
            ArenaAllocator *arena = GetArenaFromContext(scriptContext);
            pDiagScopeObjects = JsUtil::List<IDiagObjectModelWalkerBase *, ArenaAllocator>::New(arena);

            // Look for catch/with/block scopes which encompass current offset (skip block scopes as
            // they are only used for lookup within the RegSlotVariablesWalker).

            // Go the reverse way so that we find the innermost scope first;
            Js::ScopeObjectChain * pScopeObjectChain = pFBody->GetScopeObjectChain();
            for (int i = pScopeObjectChain->pScopeChain->Count() - 1 ; i >= 0; i--)
            {
                Js::DebuggerScope *debuggerScope = pScopeObjectChain->pScopeChain->Item(i);
                bool isScopeInRange = debuggerScope->IsOffsetInScope(bytecodeOffset);
                if (isScopeInRange
                    && !debuggerScope->IsParamScope()
                    && (debuggerScope->IsOwnScope() || (debuggerScope->scopeType == DiagBlockScopeDirect && debuggerScope->HasProperties())))
                {
                    switch (debuggerScope->scopeType)
                    {
                    case DiagWithScope:
                        {
                            if (enumWithScopeAlso)
                            {
                                RecyclableObjectWalker* recylableObjectWalker = Anew(arena, RecyclableObjectWalker, scriptContext,
                                    (Var)pFrame->GetRegValue(debuggerScope->GetLocation(), true));
                                pDiagScopeObjects->Add(recylableObjectWalker);
                                diagScopeVarCount += recylableObjectWalker->GetChildrenCount();
                            }
                        }
                        break;
                    case DiagCatchScopeDirect:
                    case DiagCatchScopeInObject:
                        {
                            CatchScopeWalker* catchScopeWalker = Anew(arena, CatchScopeWalker, pFrame, debuggerScope);
                            pDiagScopeObjects->Add(catchScopeWalker);
                            diagScopeVarCount += catchScopeWalker->GetChildrenCount();
                        }
                        break;
                    case DiagCatchScopeInSlot:
                    case DiagBlockScopeInSlot:
                        {
                            SlotArrayVariablesWalker* blockScopeWalker = Anew(arena, SlotArrayVariablesWalker, pFrame,
                                (Var)pFrame->GetInnerScopeFromRegSlot(debuggerScope->GetLocation()), UIGroupType_InnerScope, /* allowLexicalThis */ false);
                            pDiagScopeObjects->Add(blockScopeWalker);
                            diagScopeVarCount += blockScopeWalker->GetChildrenCount();
                        }
                        break;
                    case DiagBlockScopeDirect:
                        {
                            RegSlotVariablesWalker *pObjWalker = Anew(arena, RegSlotVariablesWalker, pFrame, debuggerScope, UIGroupType_InnerScope);
                            pDiagScopeObjects->Add(pObjWalker);
                            diagScopeVarCount += pObjWalker->GetChildrenCount();
                        }
                        break;
                    case DiagBlockScopeInObject:
                        {
                            ObjectVariablesWalker* objectVariablesWalker = Anew(arena, ObjectVariablesWalker, pFrame, pFrame->GetInnerScopeFromRegSlot(debuggerScope->GetLocation()), UIGroupType_InnerScope, /* allowLexicalThis */ false);
                            pDiagScopeObjects->Add(objectVariablesWalker);
                            diagScopeVarCount += objectVariablesWalker->GetChildrenCount();
                        }
                        break;
                    default:
                        Assert(false);
                    }
                }
            }
        }
        scopeIsInitialized = true;
        return diagScopeVarCount;
    }